

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O0

int ncnn::rnn_int8(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc_int8,
                  float *weight_xc_int8_scales,Mat *bias_c,Mat *weight_hc_int8,
                  float *weight_hc_int8_scales,Mat *hidden_state,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  long lVar4;
  double dVar5;
  void *pvVar6;
  void *pvVar7;
  float *pfVar8;
  long *in_RCX;
  long lVar9;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  long in_R8;
  long *in_R9;
  float fVar10;
  long *in_stack_00000008;
  long in_stack_00000010;
  long *in_stack_00000018;
  undefined8 *in_stack_00000020;
  float H_1;
  int q_1;
  float *output_data;
  float H;
  int i_4;
  int Hh;
  int i_3;
  int Hx;
  float descale_hc;
  float descale_xc;
  char *weight_hc_int8_ptr;
  char *weight_xc_int8_ptr;
  int q;
  float descale_h;
  float descale_x;
  char *hs;
  char *x_1;
  Option opt_quant_1;
  int i_1;
  float absmax_1;
  int ti;
  int t_1;
  Mat hidden_state_int8_scales;
  Mat hidden_state_int8;
  Option opt_quant;
  int i;
  float absmax;
  float *x;
  int t;
  Mat bottom_blob_int8_scales;
  Mat bottom_blob_int8;
  Mat gates;
  int num_output;
  int T;
  int size;
  int i_2;
  char *ptr;
  int size_1;
  Allocator *in_stack_fffffffffffff898;
  void **ppvVar11;
  Allocator *in_stack_fffffffffffff8a0;
  int in_stack_fffffffffffff8ac;
  Mat *in_stack_fffffffffffff8b0;
  undefined8 in_stack_fffffffffffff8b8;
  int iVar12;
  Mat *in_stack_fffffffffffff8c0;
  int local_684;
  Option *in_stack_fffffffffffff998;
  Mat *in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  float in_stack_fffffffffffff9ac;
  Mat *in_stack_fffffffffffff9b0;
  int local_614;
  int local_600;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  int local_5d4;
  float local_56c;
  int local_568;
  float local_564;
  int local_560;
  int local_55c;
  float *local_558;
  int *local_550;
  undefined8 local_548;
  undefined4 local_540;
  long *local_538;
  undefined4 local_530;
  undefined4 local_52c;
  undefined4 local_528;
  undefined4 local_524;
  undefined4 local_520;
  undefined8 local_518;
  void *local_510;
  int *local_508;
  undefined8 local_500;
  undefined4 local_4f8;
  long *local_4f0;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  int local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined4 local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  ulong local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  float local_47c;
  int local_478;
  float local_474;
  Mat *local_470;
  int local_464;
  void *local_460;
  int *local_458;
  undefined8 local_450;
  undefined4 local_448;
  long *local_440;
  undefined4 local_438;
  undefined4 local_434;
  undefined4 local_430;
  undefined4 local_42c;
  undefined4 local_428;
  undefined8 local_420;
  void *local_418;
  int *local_410;
  long local_408;
  undefined4 local_400;
  long *local_3f8;
  undefined4 local_3f0;
  int local_3ec;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined8 local_3d8;
  undefined4 local_3d0;
  void *local_3c0;
  int *local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  long *local_3a0;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  int local_388;
  long local_380;
  int local_374;
  int local_370;
  int local_36c;
  long *local_368;
  long local_360;
  long *local_358;
  int local_34c;
  long *local_348;
  long *local_340;
  int local_334;
  float **local_330;
  void **local_320;
  void **local_310;
  void **local_300;
  void **local_2f0;
  void **local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  int local_2c4;
  void **local_2c0;
  int local_2b4;
  long *local_2b0;
  int local_2a4;
  long *local_2a0;
  int local_288;
  undefined4 local_284;
  void **local_280;
  int local_268;
  undefined4 local_264;
  void **local_260;
  int local_248;
  undefined4 local_244;
  void **local_240;
  int local_228;
  undefined4 local_224;
  void **local_220;
  int local_208;
  undefined4 local_204;
  float **local_200;
  float *local_1f8;
  void *local_1e8;
  void *local_1d8;
  void *local_1c8;
  void *local_1b8;
  void **local_1a8;
  undefined8 local_1a0;
  undefined4 local_194;
  undefined8 local_190;
  int local_188;
  int local_184;
  void **local_180;
  undefined8 local_178;
  undefined4 local_16c;
  undefined8 local_168;
  int local_15c;
  void **local_158;
  undefined8 local_150;
  undefined4 local_144;
  undefined8 local_140;
  int local_134;
  void **local_130;
  undefined8 local_128;
  undefined4 local_11c;
  undefined8 local_118;
  undefined4 local_10c;
  float **local_108;
  long local_100;
  long local_f0;
  void **local_e8;
  long local_e0;
  void **local_d8;
  undefined8 local_d0;
  float **local_c8;
  long local_c0;
  void **local_b8;
  undefined8 local_b0;
  float **local_a8;
  undefined8 local_a0;
  float **local_98;
  long local_90;
  long local_80;
  void **local_78;
  int local_6c;
  void *local_68;
  int local_60;
  undefined1 local_59;
  void **local_58;
  void **local_50;
  int local_44;
  void **local_40;
  void **local_38;
  int local_2c;
  int local_1c;
  long *local_18;
  long local_10;
  long *local_8;
  
  local_36c = *(int *)((long)in_RDI + 0x2c);
  local_370 = (int)in_RDI[6];
  local_374 = *(int *)((long)in_RSI + 0x2c);
  local_2d8 = in_stack_00000020[2];
  local_2c0 = &local_3c0;
  local_2d0 = 4;
  local_3c0 = (void *)0x0;
  local_3b8 = (int *)0x0;
  local_3b0 = 0;
  local_3a8 = 0;
  local_3a0 = (long *)0x0;
  local_398 = 0;
  local_394 = 0;
  local_390 = 0;
  local_38c = 0;
  local_388 = 0;
  local_380 = 0;
  local_368 = in_R9;
  local_360 = in_R8;
  local_358 = in_RCX;
  local_34c = in_EDX;
  local_348 = in_RSI;
  local_340 = in_RDI;
  local_2c4 = local_374;
  Mat::create(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,(size_t)in_stack_fffffffffffff8a0,
              in_stack_fffffffffffff898);
  local_2e0 = &local_3c0;
  if (local_3c0 != (void *)0x0) {
    local_1a8 = local_2e0;
  }
  if (local_3c0 != (void *)0x0 && local_380 * local_388 != 0) {
    local_1a0 = in_stack_00000020[2];
    local_180 = &local_418;
    local_184 = local_36c;
    local_188 = local_370;
    local_190 = 1;
    local_194 = 1;
    local_418 = (void *)0x0;
    local_410 = (int *)0x0;
    local_408 = 0;
    local_400 = 0;
    local_3f8 = (long *)0x0;
    local_3f0 = 0;
    local_3ec = 0;
    local_3e8 = 0;
    local_3e4 = 0;
    local_3e0 = 0;
    local_3d8 = 0;
    Mat::create(in_stack_fffffffffffff8c0,(int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
                (int)in_stack_fffffffffffff8b8,(size_t)in_stack_fffffffffffff8b0,
                in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a0);
    local_178 = in_stack_00000020[2];
    local_158 = &local_460;
    local_15c = local_370;
    local_168 = 4;
    local_16c = 1;
    local_460 = (void *)0x0;
    local_458 = (int *)0x0;
    local_450 = 0;
    local_448 = 0;
    local_440 = (long *)0x0;
    local_438 = 0;
    local_434 = 0;
    local_430 = 0;
    local_42c = 0;
    local_428 = 0;
    local_420 = 0;
    Mat::create(in_stack_fffffffffffff8c0,(int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
                (size_t)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
                in_stack_fffffffffffff8a0);
    for (local_464 = 0; iVar12 = (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
        local_464 < local_370; local_464 = local_464 + 1) {
      local_2b0 = local_340;
      local_2b4 = local_464;
      in_stack_fffffffffffff9b0 =
           (Mat *)(*local_340 +
                  (long)*(int *)((long)local_340 + 0x2c) * (long)local_464 * local_340[2]);
      local_474 = 0.0;
      local_470 = in_stack_fffffffffffff9b0;
      for (local_478 = 0; local_478 < local_36c; local_478 = local_478 + 1) {
        dVar5 = std::fabs((double)(ulong)*(uint *)((long)&local_470->data + (long)local_478 * 4));
        in_stack_fffffffffffff9ac = SUB84(dVar5,0);
        local_47c = in_stack_fffffffffffff9ac;
        in_stack_fffffffffffff9a0 = (Mat *)std::max<float>(&local_474,&local_47c);
        local_474 = *(float *)&in_stack_fffffffffffff9a0->data;
      }
      local_80 = (long)local_464;
      local_78 = &local_460;
      in_stack_fffffffffffff998 = (Option *)((long)local_460 + local_80 * 4);
      *(float *)in_stack_fffffffffffff998 = 127.0 / local_474;
    }
    local_4c8 = *in_stack_00000020;
    local_4b8 = *(undefined4 *)(in_stack_00000020 + 2);
    uStack_4b4 = *(undefined4 *)((long)in_stack_00000020 + 0x14);
    uStack_4b0 = *(undefined4 *)(in_stack_00000020 + 3);
    uStack_4ac = *(undefined4 *)((long)in_stack_00000020 + 0x1c);
    uStack_4a0 = in_stack_00000020[5];
    local_498 = in_stack_00000020[6];
    uStack_490 = in_stack_00000020[7];
    uStack_4c0 = in_stack_00000020[2];
    local_4a8 = in_stack_00000020[4] & 0xffffffffffffff;
    quantize_to_int8(in_stack_fffffffffffff9b0,
                     (Mat *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                     in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    local_150 = in_stack_00000020[2];
    local_130 = &local_510;
    local_134 = local_374;
    local_140 = 1;
    local_144 = 1;
    local_510 = (void *)0x0;
    local_508 = (int *)0x0;
    local_500 = 0;
    local_4f8 = 0;
    local_4f0 = (long *)0x0;
    local_4e8 = 0;
    local_4e4 = 0;
    local_4e0 = 0;
    local_4dc = 0;
    local_4d8 = 0;
    local_4d0 = 0;
    Mat::create(in_stack_fffffffffffff8c0,iVar12,(size_t)in_stack_fffffffffffff8b0,
                in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a0);
    local_128 = in_stack_00000020[2];
    local_108 = &local_558;
    local_10c = 1;
    local_118 = 4;
    local_11c = 1;
    local_558 = (float *)0x0;
    local_550 = (int *)0x0;
    local_548 = 0;
    local_540 = 0;
    local_538 = (long *)0x0;
    local_530 = 0;
    local_52c = 0;
    local_528 = 0;
    local_524 = 0;
    local_520 = 0;
    local_518 = 0;
    Mat::create(in_stack_fffffffffffff8c0,iVar12,(size_t)in_stack_fffffffffffff8b0,
                in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a0);
    for (local_55c = 0; local_55c < local_370; local_55c = local_55c + 1) {
      if (local_34c == 0) {
        local_684 = local_55c;
      }
      else {
        local_684 = (local_370 + -1) - local_55c;
      }
      local_560 = local_684;
      local_564 = 0.0;
      for (local_568 = 0; local_568 < local_374; local_568 = local_568 + 1) {
        local_90 = (long)local_568;
        dVar5 = std::fabs((double)(ulong)*(uint *)(*in_stack_00000018 + local_90 * 4));
        local_56c = SUB84(dVar5,0);
        pfVar8 = std::max<float>(&local_564,&local_56c);
        local_564 = *pfVar8;
      }
      if ((local_564 != 0.0) || (NAN(local_564))) {
        local_a8 = &local_558;
        local_b0 = 0;
        *local_558 = 127.0 / local_564;
        quantize_to_int8(in_stack_fffffffffffff9b0,
                         (Mat *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                         in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      }
      else {
        local_98 = &local_558;
        local_a0 = 0;
        *local_558 = 1.0;
        local_58 = &local_510;
        local_59 = 0;
        local_60 = (int)local_4d0 * local_4d8;
        local_68 = local_510;
        for (local_6c = 0; local_50 = local_58, local_6c < local_60; local_6c = local_6c + 1) {
          *(undefined1 *)((long)local_510 + (long)local_6c) = 0;
        }
      }
      pvVar7 = local_418;
      pvVar6 = local_510;
      local_40 = &local_418;
      local_44 = local_560;
      lVar9 = (long)local_3ec * (long)local_560 * local_408;
      local_38 = &local_510;
      local_c0 = (long)local_560;
      local_b8 = &local_460;
      fVar1 = *(float *)((long)local_460 + local_c0 * 4);
      local_c8 = &local_558;
      local_d0 = 0;
      fVar2 = *local_558;
      for (local_5d4 = 0; local_5d4 < local_374; local_5d4 = local_5d4 + 1) {
        local_18 = local_358;
        local_1c = local_5d4;
        local_2c = local_5d4;
        local_5f4 = 0;
        for (local_5f8 = 0; local_5f8 < local_36c; local_5f8 = local_5f8 + 1) {
          local_5f4 = (int)*(char *)(*local_358 +
                                     (long)*(int *)((long)local_358 + 0x2c) * (long)local_5d4 *
                                     local_358[2] + (long)local_5f8) *
                      (int)*(char *)((long)pvVar7 + local_5f8 + lVar9) + local_5f4;
        }
        local_5fc = 0;
        for (local_600 = 0; local_600 < local_374; local_600 = local_600 + 1) {
          local_5fc = (int)*(char *)(*in_stack_00000008 +
                                     (long)*(int *)((long)in_stack_00000008 + 0x2c) *
                                     (long)local_5d4 * in_stack_00000008[2] + (long)local_600) *
                      (int)*(char *)((long)pvVar6 + (long)local_600) + local_5fc;
        }
        local_10 = (long)local_5d4;
        local_8 = local_368;
        fVar10 = tanhf(*(float *)(*local_368 + local_10 * 4) +
                       (float)local_5f4 *
                       (1.0 / fVar1) * (1.0 / *(float *)(local_360 + (long)local_5d4 * 4)) +
                       (float)local_5fc *
                       (1.0 / fVar2) * (1.0 / *(float *)(in_stack_00000010 + (long)local_5d4 * 4)));
        local_e0 = (long)local_5d4;
        local_d8 = &local_3c0;
        *(float *)((long)local_3c0 + local_e0 * 4) = fVar10;
      }
      local_2a0 = local_348;
      local_2a4 = local_560;
      lVar9 = *local_348;
      iVar12 = *(int *)((long)local_348 + 0x2c);
      lVar4 = local_348[2];
      for (local_614 = 0; local_614 < local_374; local_614 = local_614 + 1) {
        local_f0 = (long)local_614;
        local_e8 = &local_3c0;
        uVar3 = *(undefined4 *)((long)local_3c0 + local_f0 * 4);
        local_100 = (long)local_614;
        *(undefined4 *)(*in_stack_00000018 + local_100 * 4) = uVar3;
        *(undefined4 *)(lVar9 + (long)iVar12 * (long)local_560 * lVar4 + (long)local_614 * 4) =
             uVar3;
      }
    }
    local_334 = 0;
    local_3d0 = 1;
    local_330 = &local_558;
    local_200 = local_330;
    if (local_550 != (int *)0x0) {
      local_204 = 0xffffffff;
      LOCK();
      local_208 = *local_550;
      *local_550 = *local_550 + -1;
      UNLOCK();
      if (local_208 == 1) {
        if (local_538 == (long *)0x0) {
          local_1f8 = local_558;
          if (local_558 != (float *)0x0) {
            free(local_558);
          }
        }
        else {
          (**(code **)(*local_538 + 0x18))(local_538,local_558);
        }
      }
    }
    local_558 = (float *)0x0;
    local_548 = 0;
    local_540 = 0;
    local_530 = 0;
    local_52c = 0;
    local_528 = 0;
    local_524 = 0;
    local_520 = 0;
    local_518 = 0;
    local_550 = (int *)0x0;
    local_320 = &local_510;
    local_220 = local_320;
    if (local_508 != (int *)0x0) {
      local_224 = 0xffffffff;
      LOCK();
      local_228 = *local_508;
      *local_508 = *local_508 + -1;
      UNLOCK();
      if (local_228 == 1) {
        if (local_4f0 == (long *)0x0) {
          local_1e8 = local_510;
          if (local_510 != (void *)0x0) {
            free(local_510);
          }
        }
        else {
          (**(code **)(*local_4f0 + 0x18))(local_4f0,local_510);
        }
      }
    }
    local_510 = (void *)0x0;
    local_500 = 0;
    local_4f8 = 0;
    local_4e8 = 0;
    local_4e4 = 0;
    local_4e0 = 0;
    local_4dc = 0;
    local_4d8 = 0;
    local_4d0 = 0;
    local_508 = (int *)0x0;
    ppvVar11 = &local_460;
    local_310 = ppvVar11;
    local_240 = ppvVar11;
    if (local_458 != (int *)0x0) {
      local_244 = 0xffffffff;
      LOCK();
      local_248 = *local_458;
      *local_458 = *local_458 + -1;
      UNLOCK();
      if (local_248 == 1) {
        if (local_440 == (long *)0x0) {
          local_1d8 = local_460;
          if (local_460 != (void *)0x0) {
            free(local_460);
          }
        }
        else {
          (**(code **)(*local_440 + 0x18))(local_440,local_460);
        }
      }
    }
    *ppvVar11 = (void *)0x0;
    ppvVar11[2] = (void *)0x0;
    *(undefined4 *)(ppvVar11 + 3) = 0;
    *(undefined4 *)(ppvVar11 + 5) = 0;
    *(undefined4 *)((long)ppvVar11 + 0x2c) = 0;
    *(undefined4 *)(ppvVar11 + 6) = 0;
    *(undefined4 *)((long)ppvVar11 + 0x34) = 0;
    *(undefined4 *)(ppvVar11 + 7) = 0;
    ppvVar11[8] = (void *)0x0;
    ppvVar11[1] = (void *)0x0;
    ppvVar11 = &local_418;
    local_300 = ppvVar11;
    local_260 = ppvVar11;
    if (local_410 != (int *)0x0) {
      local_264 = 0xffffffff;
      LOCK();
      local_268 = *local_410;
      *local_410 = *local_410 + -1;
      UNLOCK();
      if (local_268 == 1) {
        if (local_3f8 == (long *)0x0) {
          local_1c8 = local_418;
          if (local_418 != (void *)0x0) {
            free(local_418);
          }
        }
        else {
          (**(code **)(*local_3f8 + 0x18))(local_3f8,local_418);
        }
      }
    }
    *ppvVar11 = (void *)0x0;
    ppvVar11[2] = (void *)0x0;
    *(undefined4 *)(ppvVar11 + 3) = 0;
    *(undefined4 *)(ppvVar11 + 5) = 0;
    *(undefined4 *)((long)ppvVar11 + 0x2c) = 0;
    *(undefined4 *)(ppvVar11 + 6) = 0;
    *(undefined4 *)((long)ppvVar11 + 0x34) = 0;
    *(undefined4 *)(ppvVar11 + 7) = 0;
    ppvVar11[8] = (void *)0x0;
    ppvVar11[1] = (void *)0x0;
  }
  else {
    local_334 = -100;
    local_3d0 = 1;
  }
  ppvVar11 = &local_3c0;
  if (local_3b8 != (int *)0x0) {
    local_284 = 0xffffffff;
    LOCK();
    local_288 = *local_3b8;
    *local_3b8 = *local_3b8 + -1;
    UNLOCK();
    if (local_288 == 1) {
      local_2f0 = ppvVar11;
      local_280 = ppvVar11;
      if (local_3a0 == (long *)0x0) {
        local_1b8 = local_3c0;
        if (local_3c0 != (void *)0x0) {
          free(local_3c0);
        }
      }
      else {
        (**(code **)(*local_3a0 + 0x18))(local_3a0,local_3c0);
      }
    }
  }
  *ppvVar11 = (void *)0x0;
  ppvVar11[2] = (void *)0x0;
  *(undefined4 *)(ppvVar11 + 3) = 0;
  *(undefined4 *)(ppvVar11 + 5) = 0;
  *(undefined4 *)((long)ppvVar11 + 0x2c) = 0;
  *(undefined4 *)(ppvVar11 + 6) = 0;
  *(undefined4 *)((long)ppvVar11 + 0x34) = 0;
  *(undefined4 *)(ppvVar11 + 7) = 0;
  ppvVar11[8] = (void *)0x0;
  ppvVar11[1] = (void *)0x0;
  return local_334;
}

Assistant:

static int rnn_int8(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc_int8, const float* weight_xc_int8_scales, const Mat& bias_c, const Mat& weight_hc_int8, const float* weight_hc_int8_scales, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // num_output
    Mat gates(num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8(size, T, (size_t)1u, 1, opt.workspace_allocator);
    Mat bottom_blob_int8_scales(T, (size_t)4u, 1, opt.workspace_allocator);
    {
        for (int t = 0; t < T; t++)
        {
            const float* x = bottom_blob.row(t);

            float absmax = 0.f;
            for (int i = 0; i < size; i++)
            {
                absmax = std::max(absmax, (float)fabs(x[i]));
            }

            bottom_blob_int8_scales[t] = 127.f / absmax;
        }

        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_quant);
    }

    Mat hidden_state_int8(num_output, (size_t)1u, 1, opt.workspace_allocator);
    Mat hidden_state_int8_scales(1, (size_t)4u, 1, opt.workspace_allocator);

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        // dynamic quantize hidden_state
        {
            float absmax = 0.f;
            for (int i = 0; i < num_output; i++)
            {
                absmax = std::max(absmax, (float)fabs(hidden_state[i]));
            }

            if (absmax == 0.f)
            {
                hidden_state_int8_scales[0] = 1.f;
                hidden_state_int8.fill<signed char>(0);
            }
            else
            {
                hidden_state_int8_scales[0] = 127.f / absmax;

                Option opt_quant = opt;
                opt_quant.blob_allocator = opt.workspace_allocator;
                opt_quant.use_packing_layout = false;
                quantize_to_int8(hidden_state, hidden_state_int8, hidden_state_int8_scales, opt_quant);
            }
        }

        const signed char* x = bottom_blob_int8.row<const signed char>(ti);
        const signed char* hs = hidden_state_int8;
        const float descale_x = 1.f / bottom_blob_int8_scales[ti];
        const float descale_h = 1.f / hidden_state_int8_scales[0];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const signed char* weight_xc_int8_ptr = weight_xc_int8.row<const signed char>(q);
            const signed char* weight_hc_int8_ptr = weight_hc_int8.row<const signed char>(q);

            const float descale_xc = 1.f / weight_xc_int8_scales[q];
            const float descale_hc = 1.f / weight_hc_int8_scales[q];

            int Hx = 0;
            for (int i = 0; i < size; i++)
            {
                Hx += weight_xc_int8_ptr[i] * x[i];
            }

            int Hh = 0;
            for (int i = 0; i < num_output; i++)
            {
                Hh += weight_hc_int8_ptr[i] * hs[i];
            }

            float H = bias_c[q] + Hx * (descale_x * descale_xc) + Hh * (descale_h * descale_hc);

            H = tanhf(H);

            gates[q] = H;
        }

        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            float H = gates[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}